

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

N_Vector N_VNew_ManyVector(sunindextype num_subvectors,N_Vector *vec_array,
                          SUNContext_conflict sunctx)

{
  N_Vector p_Var1;
  long *plVar2;
  void *pvVar3;
  long lVar4;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  sunindextype local_length;
  sunindextype i;
  N_VectorContent_ManyVector content;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  long local_40;
  long local_38;
  
  for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
  }
  p_Var1 = (N_Vector)N_VNewEmpty(in_RDX);
  p_Var1->ops->nvgetvectorid = N_VGetVectorID_ManyVector;
  p_Var1->ops->nvcloneempty = N_VCloneEmpty_ManyVector;
  p_Var1->ops->nvclone = N_VClone_ManyVector;
  p_Var1->ops->nvdestroy = N_VDestroy_ManyVector;
  p_Var1->ops->nvspace = N_VSpace_ManyVector;
  p_Var1->ops->nvgetlength = N_VGetLength_ManyVector;
  p_Var1->ops->nvlinearsum = N_VLinearSum_ManyVector;
  p_Var1->ops->nvconst = N_VConst_ManyVector;
  p_Var1->ops->nvprod = N_VProd_ManyVector;
  p_Var1->ops->nvdiv = N_VDiv_ManyVector;
  p_Var1->ops->nvscale = N_VScale_ManyVector;
  p_Var1->ops->nvabs = N_VAbs_ManyVector;
  p_Var1->ops->nvinv = N_VInv_ManyVector;
  p_Var1->ops->nvaddconst = N_VAddConst_ManyVector;
  p_Var1->ops->nvdotprod = N_VDotProdLocal_ManyVector;
  p_Var1->ops->nvmaxnorm = N_VMaxNormLocal_ManyVector;
  p_Var1->ops->nvwrmsnorm = N_VWrmsNorm_ManyVector;
  p_Var1->ops->nvwrmsnormmask = N_VWrmsNormMask_ManyVector;
  p_Var1->ops->nvmin = N_VMinLocal_ManyVector;
  p_Var1->ops->nvwl2norm = N_VWL2Norm_ManyVector;
  p_Var1->ops->nvl1norm = N_VL1NormLocal_ManyVector;
  p_Var1->ops->nvcompare = N_VCompare_ManyVector;
  p_Var1->ops->nvinvtest = N_VInvTestLocal_ManyVector;
  p_Var1->ops->nvconstrmask = N_VConstrMaskLocal_ManyVector;
  p_Var1->ops->nvminquotient = N_VMinQuotientLocal_ManyVector;
  p_Var1->ops->nvlinearcombination = N_VLinearCombination_ManyVector;
  p_Var1->ops->nvscaleaddmulti = N_VScaleAddMulti_ManyVector;
  p_Var1->ops->nvdotprodmulti = N_VDotProdMulti_ManyVector;
  p_Var1->ops->nvwrmsnormvectorarray = N_VWrmsNormVectorArray_ManyVector;
  p_Var1->ops->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;
  p_Var1->ops->nvdotprodlocal = N_VDotProdLocal_ManyVector;
  p_Var1->ops->nvmaxnormlocal = N_VMaxNormLocal_ManyVector;
  p_Var1->ops->nvminlocal = N_VMinLocal_ManyVector;
  p_Var1->ops->nvl1normlocal = N_VL1NormLocal_ManyVector;
  p_Var1->ops->nvinvtestlocal = N_VInvTestLocal_ManyVector;
  p_Var1->ops->nvconstrmasklocal = N_VConstrMaskLocal_ManyVector;
  p_Var1->ops->nvminquotientlocal = N_VMinQuotientLocal_ManyVector;
  p_Var1->ops->nvwsqrsumlocal = N_VWSqrSumLocal_ManyVector;
  p_Var1->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_ManyVector;
  p_Var1->ops->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;
  p_Var1->ops->nvbufsize = N_VBufSize_ManyVector;
  p_Var1->ops->nvbufpack = N_VBufPack_ManyVector;
  p_Var1->ops->nvbufunpack = N_VBufUnpack_ManyVector;
  p_Var1->ops->nvprint = N_VPrint_ManyVector;
  p_Var1->ops->nvprintfile = N_VPrintFile_ManyVector;
  plVar2 = (long *)malloc(0x20);
  p_Var1->content = plVar2;
  *plVar2 = in_RDI;
  *(undefined4 *)(plVar2 + 3) = 0;
  plVar2[2] = 0;
  pvVar3 = malloc(in_RDI << 3);
  plVar2[2] = (long)pvVar3;
  for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
    *(undefined8 *)(plVar2[2] + local_38 * 8) = *(undefined8 *)(in_RSI + local_38 * 8);
  }
  local_40 = 0;
  for (local_38 = 0; local_38 < in_RDI; local_38 = local_38 + 1) {
    lVar4 = N_VGetLength(*(undefined8 *)(in_RSI + local_38 * 8));
    local_40 = lVar4 + local_40;
  }
  plVar2[1] = local_40;
  return p_Var1;
}

Assistant:

N_Vector N_VNew_ManyVector(sunindextype num_subvectors, N_Vector* vec_array,
                           SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  N_Vector v;
  N_VectorContent_ManyVector content;
  sunindextype i, local_length;

  /* Check that input N_Vectors are non-NULL */
  SUNAssertNull(vec_array, SUN_ERR_ARG_CORRUPT);
  for (i = 0; i < num_subvectors; i++)
  {
    SUNAssertNull(vec_array[i], SUN_ERR_ARG_CORRUPT);
  }

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */

  /* constructors, destructors, and utility operations */
  v->ops->nvgetvectorid = N_VGetVectorID_ManyVector;
  v->ops->nvcloneempty  = N_VCloneEmpty_ManyVector;
  v->ops->nvclone       = N_VClone_ManyVector;
  v->ops->nvdestroy     = N_VDestroy_ManyVector;
  v->ops->nvspace       = N_VSpace_ManyVector;
  v->ops->nvgetlength   = N_VGetLength_ManyVector;

  /* standard vector operations */
  v->ops->nvlinearsum    = N_VLinearSum_ManyVector;
  v->ops->nvconst        = N_VConst_ManyVector;
  v->ops->nvprod         = N_VProd_ManyVector;
  v->ops->nvdiv          = N_VDiv_ManyVector;
  v->ops->nvscale        = N_VScale_ManyVector;
  v->ops->nvabs          = N_VAbs_ManyVector;
  v->ops->nvinv          = N_VInv_ManyVector;
  v->ops->nvaddconst     = N_VAddConst_ManyVector;
  v->ops->nvdotprod      = N_VDotProdLocal_ManyVector;
  v->ops->nvmaxnorm      = N_VMaxNormLocal_ManyVector;
  v->ops->nvwrmsnorm     = N_VWrmsNorm_ManyVector;
  v->ops->nvwrmsnormmask = N_VWrmsNormMask_ManyVector;
  v->ops->nvmin          = N_VMinLocal_ManyVector;
  v->ops->nvwl2norm      = N_VWL2Norm_ManyVector;
  v->ops->nvl1norm       = N_VL1NormLocal_ManyVector;
  v->ops->nvcompare      = N_VCompare_ManyVector;
  v->ops->nvinvtest      = N_VInvTestLocal_ManyVector;
  v->ops->nvconstrmask   = N_VConstrMaskLocal_ManyVector;
  v->ops->nvminquotient  = N_VMinQuotientLocal_ManyVector;

  /* fused vector operations */
  v->ops->nvlinearcombination = N_VLinearCombination_ManyVector;
  v->ops->nvscaleaddmulti     = N_VScaleAddMulti_ManyVector;
  v->ops->nvdotprodmulti      = N_VDotProdMulti_ManyVector;

  /* vector array operations */
  v->ops->nvwrmsnormvectorarray     = N_VWrmsNormVectorArray_ManyVector;
  v->ops->nvwrmsnormmaskvectorarray = N_VWrmsNormMaskVectorArray_ManyVector;

  /* local reduction operations */
  v->ops->nvdotprodlocal     = N_VDotProdLocal_ManyVector;
  v->ops->nvmaxnormlocal     = N_VMaxNormLocal_ManyVector;
  v->ops->nvminlocal         = N_VMinLocal_ManyVector;
  v->ops->nvl1normlocal      = N_VL1NormLocal_ManyVector;
  v->ops->nvinvtestlocal     = N_VInvTestLocal_ManyVector;
  v->ops->nvconstrmasklocal  = N_VConstrMaskLocal_ManyVector;
  v->ops->nvminquotientlocal = N_VMinQuotientLocal_ManyVector;
  v->ops->nvwsqrsumlocal     = N_VWSqrSumLocal_ManyVector;
  v->ops->nvwsqrsummasklocal = N_VWSqrSumMaskLocal_ManyVector;

  /* single buffer reduction operations */
  v->ops->nvdotprodmultilocal = N_VDotProdMultiLocal_ManyVector;

  /* XBraid interface operations */
  v->ops->nvbufsize   = N_VBufSize_ManyVector;
  v->ops->nvbufpack   = N_VBufPack_ManyVector;
  v->ops->nvbufunpack = N_VBufUnpack_ManyVector;

  /* debugging functions */
  v->ops->nvprint     = N_VPrint_ManyVector;
  v->ops->nvprintfile = N_VPrintFile_ManyVector;

  /* Create content */
  content = NULL;
  content = (N_VectorContent_ManyVector)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  v->content = content;

  /* Attach content components */

  /* allocate and set subvector array */
  content->num_subvectors = num_subvectors;
  content->own_data       = SUNFALSE;

  content->subvec_array = NULL;
  content->subvec_array = (N_Vector*)malloc(num_subvectors * sizeof(N_Vector));
  SUNAssertNull(content->subvec_array, SUN_ERR_MALLOC_FAIL);

  for (i = 0; i < num_subvectors; i++)
  {
    content->subvec_array[i] = vec_array[i];
  }

  /* Determine overall ManyVector length: sum contributions from all subvectors */
  local_length = 0;
  for (i = 0; i < num_subvectors; i++)
  {
    SUNAssertNull(vec_array[i]->ops->nvgetlength, SUN_ERR_NOT_IMPLEMENTED);
    local_length += N_VGetLength(vec_array[i]);
    SUNCheckLastErrNull();
  }
  content->global_length = local_length;

  return (v);
}